

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O0

int ffgtrm(fitsfile *gfptr,int rmopt,int *status)

{
  int iVar1;
  bool bVar2;
  undefined1 local_5e08 [8];
  HDUtracker HDU;
  long nmembers;
  long i;
  int *piStack_28;
  int hdutype;
  int *status_local;
  fitsfile *pfStack_18;
  int rmopt_local;
  fitsfile *gfptr_local;
  
  HDU.newPosition[0x3e6] = 0;
  HDU.newPosition[999] = 0;
  if (*status == 0) {
    piStack_28 = status;
    status_local._4_4_ = rmopt;
    pfStack_18 = gfptr;
    if (rmopt == 0) {
      iVar1 = ffgtnm(gfptr,(long *)(HDU.newPosition + 0x3e6),status);
      *piStack_28 = iVar1;
      nmembers._0_4_ = HDU.newPosition[0x3e6];
      nmembers._4_4_ = HDU.newPosition[999];
      while( true ) {
        bVar2 = false;
        if (0 < nmembers) {
          bVar2 = *piStack_28 == 0;
        }
        if (!bVar2) break;
        iVar1 = ffgmrm(pfStack_18,nmembers,1,piStack_28);
        *piStack_28 = iVar1;
        nmembers = nmembers + -1;
      }
    }
    else if (rmopt == 3) {
      local_5e08._0_4_ = 0;
      iVar1 = fftsad(gfptr,(HDUtracker *)local_5e08,(int *)0x0,(char *)0x0);
      *piStack_28 = iVar1;
      iVar1 = ffgtrmr(pfStack_18,(HDUtracker *)local_5e08,piStack_28);
      *piStack_28 = iVar1;
      for (nmembers = 0; nmembers < (int)local_5e08._0_4_; nmembers = nmembers + 1) {
        free(HDU.filename[nmembers + -1]);
        free(HDU.newFilename[nmembers + -1]);
      }
    }
    else {
      *status = 0x15b;
      ffpmsg("Invalid value for the rmopt parameter specified (ffgtrm)");
    }
    iVar1 = ffgmul(pfStack_18,0,piStack_28);
    *piStack_28 = iVar1;
    iVar1 = ffdhdu(pfStack_18,(int *)((long)&i + 4),piStack_28);
    *piStack_28 = iVar1;
    gfptr_local._4_4_ = *piStack_28;
  }
  else {
    gfptr_local._4_4_ = *status;
  }
  return gfptr_local._4_4_;
}

Assistant:

int ffgtrm(fitsfile *gfptr,  /* FITS file pointer to group                   */
	   int       rmopt,  /* code specifying if member
				elements are to be deleted:
				OPT_RM_GPT ==> remove only group table
				OPT_RM_ALL ==> recursively remove members
				and their members (if groups)                */
	   int      *status) /* return status code                           */
	    
/*
  remove a grouping table, and optionally all its members. Any groups 
  containing the grouping table are updated, and all members (if not 
  deleted) have their GRPIDn and GRPLCn keywords updated accordingly. 
  If the (deleted) members are members of another grouping table then those
  tables are also updated. The CHDU of the FITS file pointed to by gfptr must 
  be positioned to the grouping table to be deleted.
*/

{
  int hdutype;

  long i;
  long nmembers = 0;

  HDUtracker HDU;
  

  if(*status != 0) return(*status);

  /*
     remove the grouping table depending upon the rmopt parameter
  */

  switch(rmopt)
    {

    case OPT_RM_GPT:

      /*
	 for this option, the grouping table is deleted, but the member
	 HDUs remain; in this case we only have to remove each member from
	 the grouping table by calling fits_remove_member() with the
	 OPT_RM_ENTRY option
      */

      /* get the number of members contained by this table */

      *status = fits_get_num_members(gfptr,&nmembers,status);

      /* loop over all grouping table members and remove them */

      for(i = nmembers; i > 0 && *status == 0; --i)
	*status = fits_remove_member(gfptr,i,OPT_RM_ENTRY,status);
      
	break;

    case OPT_RM_ALL:

      /*
	for this option the entire Group is deleted -- this includes all
	members and their members (if grouping tables themselves). Call 
	the recursive form of this function to perform the removal.
      */

      /* add the current grouping table to the HDUtracker struct */

      HDU.nHDU = 0;

      *status = fftsad(gfptr,&HDU,NULL,NULL);

      /* call the recursive group remove function */

      *status = ffgtrmr(gfptr,&HDU,status);

      /* free the memory allocated to the HDUtracker struct */

      for(i = 0; i < HDU.nHDU; ++i)
	{
	  free(HDU.filename[i]);
	  free(HDU.newFilename[i]);
	}

      break;

    default:
      
      *status = BAD_OPTION;
      ffpmsg("Invalid value for the rmopt parameter specified (ffgtrm)");
      break;

     }

  /*
     if all went well then unlink and delete the grouping table HDU
  */

  *status = ffgmul(gfptr,0,status);

  *status = fits_delete_hdu(gfptr,&hdutype,status);
      
  return(*status);
}